

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_login(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  tclpkcs11_handle *handle;
  int iVar2;
  long lVar3;
  Tcl_Obj *pTVar4;
  CK_UTF8CHAR_PTR pCVar5;
  CK_RV errorCode;
  char *pcVar6;
  ProcErrorProc *pPVar7;
  long slotid_long;
  int password_len;
  
  if (cd == (ClientData)0x0) {
    pPVar7 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "invalid clientdata";
  }
  else if (objc == 4) {
    pTVar4 = objv[2];
    pTVar1 = objv[3];
    lVar3 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar3 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar3 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar2 = (*tclStubsPtr->tcl_GetLongFromObj)((Tcl_Interp_conflict *)interp,pTVar4,&slotid_long);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = tclpkcs11_start_session(handle,slotid_long);
      if (iVar2 == 0) {
        pCVar5 = (CK_UTF8CHAR_PTR)(*tclStubsPtr->tcl_GetStringFromObj)(pTVar1,&password_len);
        errorCode = (*handle->pkcs11->C_Login)(handle->session,1,pCVar5,(long)password_len);
        if (errorCode == 0x100) {
LAB_0010396a:
          pPVar7 = tclStubsPtr->tcl_SetObjResult;
          pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(1);
          (*pPVar7)((Tcl_Interp_conflict *)interp,pTVar4);
          return 0;
        }
        if (errorCode == 0xa0) {
          pPVar7 = tclStubsPtr->tcl_SetObjResult;
          pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(0);
          (*pPVar7)((Tcl_Interp_conflict *)interp,pTVar4);
          return 0;
        }
        if (errorCode == 0) goto LAB_0010396a;
        pPVar7 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        errorCode = (CK_RV)iVar2;
        pPVar7 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar4 = tclpkcs11_pkcs11_error(errorCode);
      goto LAB_0010390a;
    }
    pPVar7 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "invalid handle";
  }
  else {
    pPVar7 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "wrong # args: should be \"pki::pkcs11::login handle slot password\"";
  }
  pTVar4 = (*tclStubsPtr->tcl_NewStringObj)(pcVar6,-1);
LAB_0010390a:
  (*pPVar7)((Tcl_Interp_conflict *)interp,pTVar4);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_login(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid, *tcl_password;
  long slotid_long;
  char *password;
  int password_len;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 4) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::login handle slot password\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  tcl_password = objv[3];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  password = Tcl_GetStringFromObj(tcl_password, &password_len);

  chk_rv = handle->pkcs11->C_Login(handle->session, CKU_USER, (CK_UTF8CHAR_PTR) password, password_len);
  switch (chk_rv) {
    case CKR_OK:
    case CKR_USER_ALREADY_LOGGED_IN:
      Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));

      break;
    case CKR_PIN_INCORRECT:
      Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));

      break;
    default:
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      return(TCL_ERROR);
  }

  return(TCL_OK);
}